

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void __thiscall pobr::utils::Logger::Exception::Exception(Exception *this,string *error)

{
  *(undefined ***)this = &PTR__Exception_00116a20;
  std::__cxx11::string::string((string *)&this->error,(string *)error);
  return;
}

Assistant:

Exception::Exception(const std::string& error) noexcept:
error(error)
{}